

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUserDefinedIO.cpp
# Opt level: O1

void __thiscall
vkt::tessellation::anon_unknown_1::UserDefinedIOTest::UserDefinedIOTest
          (UserDefinedIOTest *this,TestContext *testCtx,string *name,string *description,
          CaseDefinition *caseDef)

{
  Precision *pPVar1;
  IOType IVar2;
  VertexIOArraySize VVar3;
  IOType IVar4;
  pointer pcVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long *plVar9;
  IOBlock *this_00;
  StructType *pSVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_01;
  anon_struct_8_2_bfd9d0cb_for_basic aVar11;
  pointer pMVar12;
  pointer pMVar13;
  ostream *poVar14;
  pointer pSVar15;
  long *plVar16;
  size_type *psVar17;
  undefined **ppuVar18;
  int precision;
  int precision_00;
  byte bVar19;
  long lVar20;
  int *piVar21;
  long lVar22;
  bool bVar23;
  vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
  blockMembers;
  Variable var1;
  Variable var0;
  string inMaybePatch;
  string outMaybePatch;
  string vertexAttrArrayInputSize;
  VarType highpFloat;
  VarType structVarType;
  ostringstream tcsDeclarations;
  ostringstream tcsStatements;
  ostringstream tesStatements;
  ostringstream tesDeclarations;
  undefined1 local_938 [40];
  undefined1 local_910 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_8f8;
  VarType local_8e8;
  bool local_8d0;
  undefined1 local_8c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8b8;
  StructType *local_8a0;
  ulong local_898;
  VertexIOArraySize local_88c;
  vector<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
  *local_888;
  vector<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
  *local_880;
  long local_878;
  undefined1 local_870 [16];
  undefined1 local_860 [16];
  undefined1 local_850 [16];
  Data local_840;
  bool local_830;
  ios_base local_800 [264];
  long *local_6f8;
  long local_6f0;
  long local_6e8;
  long lStack_6e0;
  long *local_6d8;
  long local_6d0;
  long local_6c8;
  long lStack_6c0;
  string *local_6b8;
  string *local_6b0;
  string *local_6a8;
  string *local_6a0;
  vector<glu::StructType,_std::allocator<glu::StructType>_> *local_698;
  string local_690;
  VarType local_670;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_658;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_650;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_648;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_640;
  string *local_638;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_630;
  VarType local_628;
  undefined1 *local_610;
  undefined8 local_608;
  undefined1 local_600;
  undefined7 uStack_5ff;
  ios_base local_5a0 [264];
  ostringstream local_498 [112];
  ios_base local_428 [264];
  ostringstream local_320 [112];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  tcu::TestCase::TestCase
            ((TestCase *)this,testCtx,(name->_M_dataplus)._M_p,(description->_M_dataplus)._M_p);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__UserDefinedIOTest_00d2f3c0;
  IVar2 = caseDef->ioType;
  (this->m_caseDef).primitiveType = caseDef->primitiveType;
  (this->m_caseDef).ioType = IVar2;
  (this->m_caseDef).vertexIOArraySize = caseDef->vertexIOArraySize;
  local_638 = &(this->m_caseDef).referenceImagePath;
  local_630 = &(this->m_caseDef).referenceImagePath.field_2;
  (this->m_caseDef).referenceImagePath._M_dataplus._M_p = (pointer)local_630;
  pcVar5 = (caseDef->referenceImagePath)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_638,pcVar5,pcVar5 + (caseDef->referenceImagePath)._M_string_length);
  local_698 = &this->m_structTypes;
  local_880 = &this->m_tcsOutputs;
  local_888 = &this->m_tesInputs;
  local_6a0 = (string *)&this->m_tcsDeclarations;
  local_640 = &(this->m_tcsDeclarations).field_2;
  (this->m_tesInputs).
  super__Vector_base<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_tesInputs).
  super__Vector_base<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_tcsOutputs).
  super__Vector_base<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_tcsOutputs).
  super__Vector_base<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_structTypes).super__Vector_base<glu::StructType,_std::allocator<glu::StructType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_tcsOutputs).
  super__Vector_base<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_structTypes).super__Vector_base<glu::StructType,_std::allocator<glu::StructType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_structTypes).super__Vector_base<glu::StructType,_std::allocator<glu::StructType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_tesInputs).
  super__Vector_base<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_tcsDeclarations)._M_dataplus._M_p = (pointer)local_640;
  (this->m_tcsDeclarations)._M_string_length = 0;
  (this->m_tcsDeclarations).field_2._M_local_buf[0] = '\0';
  local_6a8 = (string *)&this->m_tcsStatements;
  local_648 = &(this->m_tcsStatements).field_2;
  (this->m_tcsStatements)._M_dataplus._M_p = (pointer)local_648;
  (this->m_tcsStatements)._M_string_length = 0;
  (this->m_tcsStatements).field_2._M_local_buf[0] = '\0';
  local_6b0 = (string *)&this->m_tesDeclarations;
  local_650 = &(this->m_tesDeclarations).field_2;
  (this->m_tesDeclarations)._M_dataplus._M_p = (pointer)local_650;
  (this->m_tesDeclarations)._M_string_length = 0;
  (this->m_tesDeclarations).field_2._M_local_buf[0] = '\0';
  local_6b8 = (string *)&this->m_tesStatements;
  local_658 = &(this->m_tesStatements).field_2;
  (this->m_tesStatements)._M_dataplus._M_p = (pointer)local_658;
  (this->m_tesStatements)._M_string_length = 0;
  (this->m_tesStatements).field_2._M_local_buf[0] = '\0';
  IVar2 = (this->m_caseDef).ioType;
  VVar3 = (this->m_caseDef).vertexIOArraySize;
  if (VVar3 == VERTEX_IO_ARRAY_SIZE_EXPLICIT_SPEC_MIN) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_870);
    std::ostream::operator<<(local_870,0x20);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_870);
    std::ios_base::~ios_base(local_800);
  }
  else {
    local_690._M_dataplus._M_p = (pointer)&local_690.field_2;
    if (VVar3 == VERTEX_IO_ARRAY_SIZE_EXPLICIT_SHADER_BUILTIN) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_690,"gl_MaxPatchVertices","")
      ;
    }
    else {
      if (VVar3 != VERTEX_IO_ARRAY_SIZE_IMPLICIT) {
        std::__throw_logic_error("basic_string::_M_construct null not valid");
      }
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_690,"");
    }
  }
  local_608 = 0;
  local_600 = 0;
  local_610 = &local_600;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_610);
  psVar17 = (size_type *)(plVar9 + 2);
  if ((size_type *)*plVar9 == psVar17) {
    local_860._0_8_ = *psVar17;
    local_860._8_8_ = plVar9[3];
    local_870._0_8_ = local_860;
  }
  else {
    local_860._0_8_ = *psVar17;
    local_870._0_8_ = (size_type *)*plVar9;
  }
  local_870._8_8_ = *(anon_struct_8_2_bfd9d0cb_for_basic *)(plVar9 + 1);
  *plVar9 = (long)psVar17;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append(local_870);
  local_6d8 = &local_6c8;
  plVar16 = plVar9 + 2;
  if ((long *)*plVar9 == plVar16) {
    local_6c8 = *plVar16;
    lStack_6c0 = plVar9[3];
  }
  else {
    local_6c8 = *plVar16;
    local_6d8 = (long *)*plVar9;
  }
  local_6d0 = plVar9[1];
  *plVar9 = (long)plVar16;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  if ((undefined1 *)local_870._0_8_ != local_860) {
    operator_delete((void *)local_870._0_8_,local_860._0_8_ + 1);
  }
  if (local_610 != &local_600) {
    operator_delete(local_610,CONCAT71(uStack_5ff,local_600) + 1);
  }
  local_608 = 0;
  local_600 = 0;
  local_610 = &local_600;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_610);
  plVar16 = plVar9 + 2;
  if ((long *)*plVar9 == plVar16) {
    local_860._0_8_ = *plVar16;
    local_860._8_8_ = plVar9[3];
    local_870._0_8_ = local_860;
  }
  else {
    local_860._0_8_ = *plVar16;
    local_870._0_8_ = (long *)*plVar9;
  }
  local_870._8_8_ = *(anon_struct_8_2_bfd9d0cb_for_basic *)(plVar9 + 1);
  *plVar9 = (long)plVar16;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append(local_870);
  local_6f8 = &local_6e8;
  plVar16 = plVar9 + 2;
  if ((long *)*plVar9 == plVar16) {
    local_6e8 = *plVar16;
    lStack_6e0 = plVar9[3];
  }
  else {
    local_6e8 = *plVar16;
    local_6f8 = (long *)*plVar9;
  }
  local_6f0 = plVar9[1];
  *plVar9 = (long)plVar16;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  if ((undefined1 *)local_870._0_8_ != local_860) {
    operator_delete((void *)local_870._0_8_,(ulong)(local_860._0_8_ + 1));
  }
  local_88c = VVar3;
  if (local_610 != &local_600) {
    operator_delete(local_610,CONCAT71(uStack_5ff,local_600) + 1);
  }
  IVar4 = (this->m_caseDef).ioType;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_610);
  std::__cxx11::ostringstream::ostringstream(local_498);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__cxx11::ostringstream::ostringstream(local_320);
  local_870._0_8_ = local_860;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_870,"S","");
  local_850._0_8_ = (pointer)0x0;
  local_850._8_8_ = (pointer)0x0;
  local_840._0_8_ = (pointer)0x0;
  std::vector<glu::StructType,_std::allocator<glu::StructType>_>::emplace_back<glu::StructType>
            (local_698,(StructType *)local_870);
  glu::StructType::~StructType((StructType *)local_870);
  glu::VarType::VarType(&local_670,TYPE_FLOAT,PRECISION_HIGHP);
  local_8a0 = (this->m_structTypes).
              super__Vector_base<glu::StructType,_std::allocator<glu::StructType>_>._M_impl.
              super__Vector_impl_data._M_finish + -1;
  glu::VarType::VarType(&local_628,local_8a0);
  glu::VarType::VarType((VarType *)local_870,TYPE_INT,PRECISION_HIGHP);
  glu::StructType::addMember(local_8a0,"x",(VarType *)local_870);
  glu::VarType::~VarType((VarType *)local_870);
  glu::VarType::VarType((VarType *)local_870,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  glu::StructType::addMember(local_8a0,"y",(VarType *)local_870);
  bVar19 = IVar4 < IO_TYPE_LAST & 0x2cU >> ((byte)IVar4 & 0x1f);
  glu::VarType::~VarType((VarType *)local_870);
  if (bVar19 != 0) {
    glu::VarType::VarType((VarType *)local_870,&local_670,2);
    glu::StructType::addMember(local_8a0,"z",(VarType *)local_870);
    glu::VarType::~VarType((VarType *)local_870);
    if (bVar19 != 0) {
      local_938._0_8_ = (pointer)0x0;
      local_938._8_8_ = (pointer)0x0;
      local_938._16_8_ = (pointer)0x0;
      if ((this->m_caseDef).ioType != IO_TYPE_PER_PATCH_BLOCK_ARRAY) {
        local_910._0_8_ = local_910 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_910,"blockS","");
        IOBlock::Member::Member((Member *)local_870,(string *)local_910,&local_628);
        std::
        vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
        ::push_back((vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                     *)local_938,(value_type *)local_870);
        glu::VarType::~VarType((VarType *)local_850);
        if ((undefined1 *)local_870._0_8_ != local_860) {
          operator_delete((void *)local_870._0_8_,(ulong)(local_860._0_8_ + 1));
        }
        if ((undefined1 *)local_910._0_8_ != local_910 + 0x10) {
          operator_delete((void *)local_910._0_8_,local_910._16_8_ + 1);
        }
      }
      ppuVar18 = (undefined **)(local_910 + 0x10);
      local_910._0_8_ = ppuVar18;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_910,"blockFa","");
      glu::VarType::VarType((VarType *)local_8c8,&local_670,3);
      IOBlock::Member::Member((Member *)local_870,(string *)local_910,(VarType *)local_8c8);
      std::
      vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
      ::push_back((vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                   *)local_938,(value_type *)local_870);
      glu::VarType::~VarType((VarType *)local_850);
      if ((undefined1 *)local_870._0_8_ != local_860) {
        operator_delete((void *)local_870._0_8_,(ulong)(local_860._0_8_ + 1));
      }
      glu::VarType::~VarType((VarType *)local_8c8);
      if ((undefined **)local_910._0_8_ != ppuVar18) {
        operator_delete((void *)local_910._0_8_,local_910._16_8_ + 1);
      }
      local_910._0_8_ = ppuVar18;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_910,"blockSa","");
      glu::VarType::VarType((VarType *)local_8c8,&local_628,2);
      IOBlock::Member::Member((Member *)local_870,(string *)local_910,(VarType *)local_8c8);
      std::
      vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
      ::push_back((vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                   *)local_938,(value_type *)local_870);
      glu::VarType::~VarType((VarType *)local_850);
      if ((undefined1 *)local_870._0_8_ != local_860) {
        operator_delete((void *)local_870._0_8_,(ulong)(local_860._0_8_ + 1));
      }
      glu::VarType::~VarType((VarType *)local_8c8);
      if ((undefined **)local_910._0_8_ != ppuVar18) {
        operator_delete((void *)local_910._0_8_,local_910._16_8_ + 1);
      }
      local_910._0_8_ = ppuVar18;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_910,"blockF","");
      IOBlock::Member::Member((Member *)local_870,(string *)local_910,&local_670);
      std::
      vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
      ::push_back((vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                   *)local_938,(value_type *)local_870);
      glu::VarType::~VarType((VarType *)local_850);
      if ((undefined1 *)local_870._0_8_ != local_860) {
        operator_delete((void *)local_870._0_8_,(ulong)(local_860._0_8_ + 1));
      }
      if ((undefined **)local_910._0_8_ != ppuVar18) {
        operator_delete((void *)local_910._0_8_,local_910._16_8_ + 1);
      }
      this_00 = (IOBlock *)operator_new(0x60);
      local_870._0_8_ = local_860;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_870,"TheBlock","");
      local_910._0_8_ = ppuVar18;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_910,"tcBlock","");
      IOBlock::IOBlock(this_00,(string *)local_870,(string *)local_910,
                       (vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                        *)local_938);
      local_8c8._8_8_ = (VarType *)0x0;
      local_8c8._0_8_ = this_00;
      pSVar10 = (StructType *)operator_new(0x20);
      *(undefined4 *)&(pSVar10->m_typeName)._M_string_length = 0;
      *(undefined4 *)((long)&(pSVar10->m_typeName)._M_string_length + 4) = 0;
      (pSVar10->m_typeName)._M_dataplus._M_p = (pointer)&PTR__SharedPtrState_00d2f4a0;
      *(IOBlock **)&(pSVar10->m_typeName).field_2 = this_00;
      *(undefined4 *)&(pSVar10->m_typeName)._M_string_length = 1;
      *(undefined4 *)((long)&(pSVar10->m_typeName)._M_string_length + 4) = 1;
      local_8c8._8_8_ = pSVar10;
      std::
      vector<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
      ::push_back(local_880,(value_type *)local_8c8);
      psVar17 = &(pSVar10->m_typeName)._M_string_length;
      LOCK();
      *(int *)psVar17 = (int)*psVar17 + -1;
      UNLOCK();
      if ((int)*psVar17 == 0) {
        local_8c8._0_8_ = (IOBlock *)0x0;
        (**(code **)((((string *)local_8c8._8_8_)->_M_dataplus)._M_p + 0x10))();
      }
      LOCK();
      pPVar1 = &(((Data *)(local_8c8._8_8_ + 8))->basic).precision;
      *pPVar1 = *pPVar1 - PRECISION_MEDIUMP;
      UNLOCK();
      if (*pPVar1 == PRECISION_LOWP) {
        if ((StructType *)local_8c8._8_8_ != (StructType *)0x0) {
          (**(code **)((((string *)local_8c8._8_8_)->_M_dataplus)._M_p + 8))();
        }
        local_8c8._8_4_ = TYPE_INVALID;
        local_8c8._12_4_ = PRECISION_LOWP;
      }
      if ((undefined **)local_910._0_8_ != ppuVar18) {
        operator_delete((void *)local_910._0_8_,local_910._16_8_ + 1);
      }
      if ((undefined1 *)local_870._0_8_ != local_860) {
        operator_delete((void *)local_870._0_8_,(ulong)(local_860._0_8_ + 1));
      }
      this_01 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)operator_new(0x60);
      local_870._0_8_ = local_860;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_870,"TheBlock","");
      local_910._0_8_ = ppuVar18;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_910,"teBlock","");
      IOBlock::IOBlock((IOBlock *)this_01,(string *)local_870,(string *)local_910,
                       (vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                        *)local_938);
      local_8c8._8_8_ = (VarType *)0x0;
      local_8c8._0_8_ = this_01;
      aVar11 = (anon_struct_8_2_bfd9d0cb_for_basic)operator_new(0x20);
      *(undefined4 *)((long)aVar11 + 8) = 0;
      *(undefined4 *)((long)aVar11 + 0xc) = 0;
      *(undefined ***)aVar11 = &PTR__SharedPtrState_00d2f4a0;
      *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)((long)aVar11 + 0x10) = this_01;
      *(undefined4 *)((long)aVar11 + 8) = 1;
      *(undefined4 *)((long)aVar11 + 0xc) = 1;
      local_8c8._8_8_ = aVar11;
      std::
      vector<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
      ::push_back(local_888,(value_type *)local_8c8);
      piVar21 = (int *)((long)aVar11 + 8);
      LOCK();
      *piVar21 = *piVar21 + -1;
      UNLOCK();
      if (*piVar21 == 0) {
        local_8c8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        (**(code **)((((string *)local_8c8._8_8_)->_M_dataplus)._M_p + 0x10))();
      }
      LOCK();
      pPVar1 = &(((Data *)(local_8c8._8_8_ + 8))->basic).precision;
      *pPVar1 = *pPVar1 - PRECISION_MEDIUMP;
      UNLOCK();
      if (*pPVar1 == PRECISION_LOWP) {
        if ((anon_struct_8_2_bfd9d0cb_for_basic)local_8c8._8_8_ !=
            (anon_struct_8_2_bfd9d0cb_for_basic)0x0) {
          (**(code **)((((string *)local_8c8._8_8_)->_M_dataplus)._M_p + 8))();
        }
        local_8c8._8_4_ = TYPE_INVALID;
        local_8c8._12_4_ = PRECISION_LOWP;
      }
      if ((undefined **)local_910._0_8_ != ppuVar18) {
        operator_delete((void *)local_910._0_8_,local_910._16_8_ + 1);
      }
      if ((undefined1 *)local_870._0_8_ != local_860) {
        operator_delete((void *)local_870._0_8_,(ulong)(local_860._0_8_ + 1));
      }
      std::
      vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
      ::~vector((vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                 *)local_938);
      bVar23 = true;
      goto LAB_0079e4f4;
    }
  }
  local_910._0_8_ = local_910 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_910,"in_te_s","");
  Variable::Variable((Variable *)local_870,(string *)local_910,&local_628,
                     (this->m_caseDef).ioType != IO_TYPE_PER_PATCH);
  if ((undefined1 *)local_910._0_8_ != local_910 + 0x10) {
    operator_delete((void *)local_910._0_8_,local_910._16_8_ + 1);
  }
  local_938._0_8_ = (pointer)(local_938 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_938,"in_te_f","");
  Variable::Variable((Variable *)local_910,(string *)local_938,&local_670,
                     (this->m_caseDef).ioType != IO_TYPE_PER_PATCH);
  if ((pointer)local_938._0_8_ != (pointer)(local_938 + 0x10)) {
    operator_delete((void *)local_938._0_8_,(ulong)(local_938._16_8_ + 1));
  }
  bVar23 = (this->m_caseDef).ioType != IO_TYPE_PER_PATCH_ARRAY;
  if (bVar23) {
    pMVar12 = (pointer)operator_new(0x48);
    (pMVar12->name)._M_dataplus._M_p = (pointer)&PTR__Variable_00d2f4e0;
    (pMVar12->name)._M_string_length = (size_type)((long)&(pMVar12->name).field_2 + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&(pMVar12->name)._M_string_length,local_870._8_8_,
               (undefined1 *)((long)(Type *)local_870._8_8_ + local_860._0_8_));
    glu::VarType::VarType((VarType *)&(pMVar12->type).m_data.basic,(VarType *)(local_850 + 8));
    *(bool *)&pMVar12[1].name._M_string_length = local_830;
    local_938._8_8_ = (pointer)0x0;
    local_938._0_8_ = pMVar12;
    pMVar13 = (pointer)operator_new(0x20);
    *(undefined4 *)&(pMVar13->name)._M_string_length = 0;
    *(undefined4 *)((long)&(pMVar13->name)._M_string_length + 4) = 0;
    (pMVar13->name)._M_dataplus._M_p = (pointer)&PTR__SharedPtrState_00d2f4a0;
    *(pointer *)&(pMVar13->name).field_2 = pMVar12;
    *(undefined4 *)&(pMVar13->name)._M_string_length = 1;
    *(undefined4 *)((long)&(pMVar13->name)._M_string_length + 4) = 1;
    local_938._8_8_ = pMVar13;
    std::
    vector<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
    ::push_back(local_880,(value_type *)local_938);
    psVar17 = &(pMVar13->name)._M_string_length;
    LOCK();
    *(int *)psVar17 = (int)*psVar17 + -1;
    UNLOCK();
    if ((int)*psVar17 == 0) {
      local_938._0_8_ = (pointer)0x0;
      (**(code **)((((string *)local_938._8_8_)->_M_dataplus)._M_p + 0x10))();
    }
    LOCK();
    piVar21 = (int *)((long)&((string *)local_938._8_8_)->_M_string_length + 4);
    *piVar21 = *piVar21 + -1;
    UNLOCK();
    if (*piVar21 == 0) {
      if ((pointer)local_938._8_8_ != (pointer)0x0) {
        (**(code **)((((string *)local_938._8_8_)->_M_dataplus)._M_p + 8))();
      }
      local_938._8_8_ = (pointer)0x0;
    }
    pMVar12 = (pointer)operator_new(0x48);
    (pMVar12->name)._M_dataplus._M_p = (pointer)&PTR__Variable_00d2f4e0;
    (pMVar12->name)._M_string_length = (size_type)((long)&(pMVar12->name).field_2 + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&(pMVar12->name)._M_string_length,local_870._8_8_,
               (undefined1 *)((long)(Type *)local_870._8_8_ + local_860._0_8_));
    glu::VarType::VarType((VarType *)&(pMVar12->type).m_data.basic,(VarType *)(local_850 + 8));
    *(bool *)&pMVar12[1].name._M_string_length = local_830;
    local_938._8_8_ = (pointer)0x0;
    local_938._0_8_ = pMVar12;
    pMVar13 = (pointer)operator_new(0x20);
    *(undefined4 *)&(pMVar13->name)._M_string_length = 0;
    *(undefined4 *)((long)&(pMVar13->name)._M_string_length + 4) = 0;
    (pMVar13->name)._M_dataplus._M_p = (pointer)&PTR__SharedPtrState_00d2f4a0;
    *(pointer *)&(pMVar13->name).field_2 = pMVar12;
    *(undefined4 *)&(pMVar13->name)._M_string_length = 1;
    *(undefined4 *)((long)&(pMVar13->name)._M_string_length + 4) = 1;
    local_938._8_8_ = pMVar13;
    std::
    vector<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
    ::push_back(local_888,(value_type *)local_938);
    psVar17 = &(pMVar13->name)._M_string_length;
    LOCK();
    *(int *)psVar17 = (int)*psVar17 + -1;
    UNLOCK();
    if ((int)*psVar17 == 0) {
      local_938._0_8_ = (pointer)0x0;
      (**(code **)((((string *)local_938._8_8_)->_M_dataplus)._M_p + 0x10))();
    }
    LOCK();
    piVar21 = (int *)((long)&((string *)local_938._8_8_)->_M_string_length + 4);
    *piVar21 = *piVar21 + -1;
    UNLOCK();
    if (*piVar21 == 0) {
      if ((pointer)local_938._8_8_ != (pointer)0x0) {
        (**(code **)((((string *)local_938._8_8_)->_M_dataplus)._M_p + 8))();
      }
      local_938._8_8_ = (pointer)0x0;
    }
  }
  pMVar12 = (pointer)operator_new(0x48);
  (pMVar12->name)._M_dataplus._M_p = (pointer)&PTR__Variable_00d2f4e0;
  (pMVar12->name)._M_string_length = (size_type)((long)&(pMVar12->name).field_2 + 8);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(pMVar12->name)._M_string_length,local_910._8_8_,
             (char *)(local_910._8_8_ + local_910._16_8_));
  glu::VarType::VarType((VarType *)&(pMVar12->type).m_data.basic,&local_8e8);
  *(bool *)&pMVar12[1].name._M_string_length = local_8d0;
  local_938._8_8_ = (pointer)0x0;
  local_938._0_8_ = pMVar12;
  pMVar13 = (pointer)operator_new(0x20);
  *(undefined4 *)&(pMVar13->name)._M_string_length = 0;
  *(undefined4 *)((long)&(pMVar13->name)._M_string_length + 4) = 0;
  (pMVar13->name)._M_dataplus._M_p = (pointer)&PTR__SharedPtrState_00d2f4a0;
  *(pointer *)&(pMVar13->name).field_2 = pMVar12;
  *(undefined4 *)&(pMVar13->name)._M_string_length = 1;
  *(undefined4 *)((long)&(pMVar13->name)._M_string_length + 4) = 1;
  local_938._8_8_ = pMVar13;
  std::
  vector<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
  ::push_back(local_880,(value_type *)local_938);
  psVar17 = &(pMVar13->name)._M_string_length;
  LOCK();
  *(int *)psVar17 = (int)*psVar17 + -1;
  UNLOCK();
  if ((int)*psVar17 == 0) {
    local_938._0_8_ = (pointer)0x0;
    (**(code **)((((string *)local_938._8_8_)->_M_dataplus)._M_p + 0x10))();
  }
  LOCK();
  piVar21 = (int *)((long)&((string *)local_938._8_8_)->_M_string_length + 4);
  *piVar21 = *piVar21 + -1;
  UNLOCK();
  if (*piVar21 == 0) {
    if ((pointer)local_938._8_8_ != (pointer)0x0) {
      (**(code **)((((string *)local_938._8_8_)->_M_dataplus)._M_p + 8))();
    }
    local_938._8_8_ = (pointer)0x0;
  }
  pMVar12 = (pointer)operator_new(0x48);
  (pMVar12->name)._M_dataplus._M_p = (pointer)&PTR__Variable_00d2f4e0;
  (pMVar12->name)._M_string_length = (size_type)((long)&(pMVar12->name).field_2 + 8);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(pMVar12->name)._M_string_length,local_910._8_8_,
             (char *)(local_910._8_8_ + local_910._16_8_));
  glu::VarType::VarType((VarType *)&(pMVar12->type).m_data.basic,&local_8e8);
  *(bool *)&pMVar12[1].name._M_string_length = local_8d0;
  local_938._8_8_ = (pointer)0x0;
  local_938._0_8_ = pMVar12;
  pMVar13 = (pointer)operator_new(0x20);
  *(undefined4 *)&(pMVar13->name)._M_string_length = 0;
  *(undefined4 *)((long)&(pMVar13->name)._M_string_length + 4) = 0;
  (pMVar13->name)._M_dataplus._M_p = (pointer)&PTR__SharedPtrState_00d2f4a0;
  *(pointer *)&(pMVar13->name).field_2 = pMVar12;
  *(undefined4 *)&(pMVar13->name)._M_string_length = 1;
  *(undefined4 *)((long)&(pMVar13->name)._M_string_length + 4) = 1;
  local_938._8_8_ = pMVar13;
  std::
  vector<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
  ::push_back(local_888,(value_type *)local_938);
  psVar17 = &(pMVar13->name)._M_string_length;
  LOCK();
  *(int *)psVar17 = (int)*psVar17 + -1;
  UNLOCK();
  if ((int)*psVar17 == 0) {
    local_938._0_8_ = (pointer)0x0;
    (**(code **)((((string *)local_938._8_8_)->_M_dataplus)._M_p + 0x10))();
  }
  LOCK();
  piVar21 = (int *)((long)&((string *)local_938._8_8_)->_M_string_length + 4);
  *piVar21 = *piVar21 + -1;
  UNLOCK();
  if (*piVar21 == 0) {
    if ((pointer)local_938._8_8_ != (pointer)0x0) {
      (**(code **)((((string *)local_938._8_8_)->_M_dataplus)._M_p + 8))();
    }
    local_938._8_8_ = (pointer)0x0;
  }
  local_910._0_8_ = &PTR__Variable_00d2f4e0;
  glu::VarType::~VarType(&local_8e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_910._8_8_ != &aStack_8f8) {
    operator_delete((void *)local_910._8_8_,aStack_8f8._0_8_ + 1);
  }
  local_870._0_8_ = &PTR__Variable_00d2f4e0;
  glu::VarType::~VarType((VarType *)(local_850 + 8));
  if (local_870._8_8_ != (long)local_860 + 8) {
    operator_delete((void *)local_870._8_8_,local_860._8_8_ + 1);
  }
LAB_0079e4f4:
  if (bVar23) {
    glu::decl::DeclareStructType::DeclareStructType((DeclareStructType *)local_910,local_8a0,0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_870);
    glu::decl::operator<<((ostream *)local_870,(DeclareStructType *)local_910);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_870);
    std::ios_base::~ios_base(local_800);
    plVar9 = (long *)std::__cxx11::string::append(local_8c8);
    pMVar12 = (pointer)(plVar9 + 2);
    if ((pointer)*plVar9 == pMVar12) {
      local_938._16_8_ = (pMVar12->name)._M_dataplus._M_p;
      local_938._24_8_ = plVar9[3];
      local_938._0_8_ = (pointer)(local_938 + 0x10);
    }
    else {
      local_938._16_8_ = (pMVar12->name)._M_dataplus._M_p;
      local_938._0_8_ = (pointer)*plVar9;
    }
    local_938._8_8_ = plVar9[1];
    *plVar9 = (long)pMVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_610,(char *)local_938._0_8_,local_938._8_8_);
    if ((pointer)local_938._0_8_ != (pointer)(local_938 + 0x10)) {
      operator_delete((void *)local_938._0_8_,(ulong)(local_938._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8c8._0_8_ != &local_8b8) {
      operator_delete((void *)local_8c8._0_8_,local_8b8._M_allocated_capacity + 1);
    }
    glu::StructType::~StructType((StructType *)local_910);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,"\t{\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_498,"\t\thighp float v = 1.3;\n",0x17);
  pSVar15 = (this->m_tcsOutputs).
            super__Vector_base<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_tcsOutputs).
                              super__Vector_base<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar15) >> 4)) {
    local_878 = CONCAT44(local_878._4_4_,2);
    local_898 = 0;
    lVar20 = 0;
    do {
      iVar8 = -1;
      if (IVar2 < IO_TYPE_PER_VERTEX) {
        IVar4 = (this->m_caseDef).ioType;
        if ((ulong)IVar4 < 3) {
          iVar8 = *(int *)(&DAT_00b498e4 + (ulong)IVar4 * 4);
        }
        else {
          iVar8 = (uint)(IVar4 == IO_TYPE_PER_PATCH_BLOCK_ARRAY) * 4 + -2;
        }
      }
      plVar9 = *(long **)((long)&pSVar15->m_ptr + local_898);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_610,"layout(location = ",0x12);
      poVar14 = (ostream *)std::ostream::operator<<(&local_610,(int)local_878);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,") ",2);
      if (iVar8 == 1) {
        poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_610,(char *)local_6d8,local_6d0);
        (**(code **)(*plVar9 + 0x18))((string *)local_870,plVar9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14,(char *)local_870._0_8_,local_870._8_8_);
        pMVar12 = (pointer)local_860._0_8_;
        pMVar13 = (pointer)local_870._0_8_;
        if ((undefined1 *)local_870._0_8_ != local_860) {
LAB_0079e885:
          operator_delete(pMVar13,(ulong)((long)&(pMVar12->name)._M_dataplus._M_p + 1));
        }
      }
      else {
        poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_610,(char *)local_6d8,local_6d0);
        IVar4 = (this->m_caseDef).ioType;
        if (IVar4 == IO_TYPE_PER_PATCH_BLOCK_ARRAY) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_870);
          std::ostream::operator<<((string *)local_870,2);
          std::__cxx11::stringbuf::str();
LAB_0079e7f3:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_870);
          std::ios_base::~ios_base(local_800);
        }
        else {
          if (IVar4 == IO_TYPE_PER_PATCH_ARRAY) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_870);
            std::ostream::operator<<((string *)local_870,3);
            std::__cxx11::stringbuf::str();
            goto LAB_0079e7f3;
          }
          local_938._0_8_ = local_938 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_938,"");
        }
        (**(code **)(*plVar9 + 0x20))(local_910,plVar9,local_938);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14,(char *)local_910._0_8_,local_910._8_8_);
        if ((undefined1 *)local_910._0_8_ != local_910 + 0x10) {
          operator_delete((void *)local_910._0_8_,local_910._16_8_ + 1);
        }
        pMVar12 = (pointer)local_938._16_8_;
        pMVar13 = (pointer)local_938._0_8_;
        if ((pointer)local_938._0_8_ != (pointer)(local_938 + 0x10)) goto LAB_0079e885;
      }
      iVar6 = (**(code **)(*plVar9 + 0x38))(plVar9);
      if (IO_TYPE_PER_PATCH_BLOCK_ARRAY < IVar2) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_498,"\t\tv += float(gl_InvocationID)*",0x1e);
        iVar7 = (**(code **)(*plVar9 + 0x38))(plVar9);
        de::floatToString_abi_cxx11_
                  ((string *)local_870,(de *)&DAT_00000001,(float)iVar7 * 0.4,precision);
        poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_498,(char *)local_870._0_8_,local_870._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,";\n",2);
        if ((undefined1 *)local_870._0_8_ != local_860) {
          operator_delete((void *)local_870._0_8_,(ulong)(local_860._0_8_ + 1));
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_498,"\n\t\t// Assign values to output ",0x1e);
      (**(code **)(*plVar9 + 0x10))((string *)local_870,plVar9);
      poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_498,(char *)local_870._0_8_,local_870._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
      if ((undefined1 *)local_870._0_8_ != local_860) {
        operator_delete((void *)local_870._0_8_,(ulong)(local_860._0_8_ + 1));
      }
      if (iVar8 == 1) {
        (**(code **)(*plVar9 + 0x30))((string *)local_870,plVar9,2,glslAssignBasicTypeObject);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_498,(char *)local_870._0_8_,local_870._8_8_);
        if ((undefined1 *)local_870._0_8_ != local_860) {
LAB_0079ea58:
          operator_delete((void *)local_870._0_8_,(ulong)(local_860._0_8_ + 1));
        }
      }
      else {
        (**(code **)(*plVar9 + 0x28))((string *)local_870,plVar9,iVar8,2,glslAssignBasicTypeObject);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_498,(char *)local_870._0_8_,local_870._8_8_);
        if ((undefined1 *)local_870._0_8_ != local_860) goto LAB_0079ea58;
      }
      if (IO_TYPE_PER_PATCH_BLOCK_ARRAY < IVar2) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_498,"\t\tv += float(",0xd);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_870);
        std::ostream::operator<<((string *)local_870,5);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_870);
        std::ios_base::~ios_base(local_800);
        poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_498,(char *)local_910._0_8_,local_910._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"-gl_InvocationID-1)*",0x14);
        iVar8 = (**(code **)(*plVar9 + 0x38))(plVar9);
        de::floatToString_abi_cxx11_
                  ((string *)local_870,(de *)&DAT_00000001,(float)iVar8 * 0.4,precision_00);
        poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar14,(char *)local_870._0_8_,local_870._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,";\n",2);
        if ((undefined1 *)local_870._0_8_ != local_860) {
          operator_delete((void *)local_870._0_8_,(ulong)(local_860._0_8_ + 1));
        }
        if ((undefined1 *)local_910._0_8_ != local_910 + 0x10) {
          operator_delete((void *)local_910._0_8_,local_910._16_8_ + 1);
        }
      }
      local_878 = CONCAT44(local_878._4_4_,(int)local_878 + iVar6);
      lVar20 = lVar20 + 1;
      pSVar15 = (this->m_tcsOutputs).
                super__Vector_base<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_898 = local_898 + 0x10;
    } while (lVar20 < (int)((ulong)((long)(this->m_tcsOutputs).
                                          super__Vector_base<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar15
                                   ) >> 4));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,"\t}\n",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_610,"\n",1);
  local_8c8._0_8_ = &local_8b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8c8,"in_tc_attr","");
  Variable::Variable((Variable *)local_870,(string *)local_8c8,&local_670,true);
  Variable::declareArray((string *)local_938,(Variable *)local_870,&local_690);
  plVar9 = (long *)std::__cxx11::string::replace((ulong)local_938,0,(char *)0x0,0xb24eb6);
  ppuVar18 = (undefined **)(plVar9 + 2);
  if ((undefined **)*plVar9 == ppuVar18) {
    local_910._16_8_ = *ppuVar18;
    aStack_8f8._M_allocated_capacity = plVar9[3];
    local_910._0_8_ = local_910 + 0x10;
  }
  else {
    local_910._16_8_ = *ppuVar18;
    local_910._0_8_ = (undefined **)*plVar9;
  }
  local_910._8_8_ = plVar9[1];
  *plVar9 = (long)ppuVar18;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_610,(char *)local_910._0_8_,local_910._8_8_);
  if ((undefined1 *)local_910._0_8_ != local_910 + 0x10) {
    operator_delete((void *)local_910._0_8_,(ulong)(local_910._16_8_ + 1));
  }
  if ((pointer)local_938._0_8_ != (pointer)(local_938 + 0x10)) {
    operator_delete((void *)local_938._0_8_,(ulong)(local_938._16_8_ + 1));
  }
  local_870._0_8_ = &PTR__Variable_00d2f4e0;
  glu::VarType::~VarType((VarType *)(local_850 + 8));
  if (local_870._8_8_ != (long)local_860 + 8) {
    operator_delete((void *)local_870._8_8_,local_860._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8c8._0_8_ != &local_8b8) {
    operator_delete((void *)local_8c8._0_8_,local_8b8._M_allocated_capacity + 1);
  }
  if (bVar23) {
    glu::decl::DeclareStructType::DeclareStructType((DeclareStructType *)local_910,local_8a0,0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_870);
    glu::decl::operator<<((ostream *)local_870,(DeclareStructType *)local_910);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_870);
    std::ios_base::~ios_base(local_800);
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(char *)local_938._0_8_,local_938._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,";\n",2);
    if ((pointer)local_938._0_8_ != (pointer)(local_938 + 0x10)) {
      operator_delete((void *)local_938._0_8_,(ulong)(local_938._16_8_ + 1));
    }
    glu::StructType::~StructType((StructType *)local_910);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"\tbool allOk = true;\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"\thighp uint firstFailedInputIndex = 0u;\n",0x28);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\t{\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"\t\thighp float v = 1.3;\n",0x17);
  pSVar15 = (this->m_tesInputs).
            super__Vector_base<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_tesInputs).
                              super__Vector_base<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar15) >> 4)) {
    local_88c = local_88c - VERTEX_IO_ARRAY_SIZE_EXPLICIT_SHADER_BUILTIN;
    iVar8 = 2;
    lVar20 = 0;
    lVar22 = 0;
    do {
      iVar6 = 5;
      if (IVar2 < IO_TYPE_PER_VERTEX) {
        IVar4 = (this->m_caseDef).ioType;
        if ((ulong)IVar4 < 3) {
          iVar6 = *(int *)(&DAT_00b498e4 + (ulong)IVar4 * 4);
        }
        else {
          iVar6 = (uint)(IVar4 == IO_TYPE_PER_PATCH_BLOCK_ARRAY) * 4 + -2;
        }
      }
      local_898 = CONCAT44(local_898._4_4_,iVar6);
      plVar9 = *(long **)((long)&pSVar15->m_ptr + lVar20);
      local_878 = lVar20;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"layout(location = ",0x12);
      poVar14 = (ostream *)std::ostream::operator<<(local_1a8,iVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,") ",2);
      if ((int)local_898 == 1) {
        (**(code **)(*plVar9 + 0x18))(local_910);
        plVar16 = (long *)std::__cxx11::string::replace
                                    ((ulong)local_910,0,(char *)0x0,(ulong)local_6f8);
        local_870._0_8_ = local_860;
        ppuVar18 = (undefined **)(plVar16 + 2);
        if ((undefined **)*plVar16 == ppuVar18) {
          local_860._0_8_ = *ppuVar18;
          local_860._8_8_ = plVar16[3];
        }
        else {
          local_860._0_8_ = *ppuVar18;
          local_870._0_8_ = (undefined **)*plVar16;
        }
        local_870._8_8_ = *(anon_struct_8_2_bfd9d0cb_for_basic *)(plVar16 + 1);
        *plVar16 = (long)ppuVar18;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(char *)local_870._0_8_,local_870._8_8_);
        if ((undefined1 *)local_870._0_8_ != local_860) {
          operator_delete((void *)local_870._0_8_,(ulong)(local_860._0_8_ + 1));
        }
        pMVar12 = (pointer)local_910._16_8_;
        pMVar13 = (pointer)local_910._0_8_;
        if ((undefined1 *)local_910._0_8_ != local_910 + 0x10) {
LAB_0079f178:
          operator_delete(pMVar13,(ulong)((long)&(pMVar12->name)._M_dataplus._M_p + 1));
        }
      }
      else {
        poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(char *)local_6f8,local_6f0);
        IVar4 = (this->m_caseDef).ioType;
        if (IVar4 == IO_TYPE_PER_PATCH_BLOCK_ARRAY) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_870);
          std::ostream::operator<<((ostringstream *)local_870,2);
          std::__cxx11::stringbuf::str();
LAB_0079f107:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_870);
          std::ios_base::~ios_base(local_800);
        }
        else {
          if (IVar4 == IO_TYPE_PER_PATCH_ARRAY) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_870);
            std::ostream::operator<<((ostringstream *)local_870,3);
            std::__cxx11::stringbuf::str();
            goto LAB_0079f107;
          }
          if (local_88c < VERTEX_IO_ARRAY_SIZE_EXPLICIT_SPEC_MIN) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_870);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_870,local_690._M_dataplus._M_p,local_690._M_string_length);
            std::__cxx11::stringbuf::str();
            goto LAB_0079f107;
          }
          local_938._0_8_ = local_938 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_938,"");
        }
        (**(code **)(*plVar9 + 0x20))(local_910,plVar9,local_938);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14,(char *)local_910._0_8_,local_910._8_8_);
        if ((undefined1 *)local_910._0_8_ != local_910 + 0x10) {
          operator_delete((void *)local_910._0_8_,(ulong)(local_910._16_8_ + 1));
        }
        pMVar12 = (pointer)local_938._16_8_;
        pMVar13 = (pointer)local_938._0_8_;
        if ((pointer)local_938._0_8_ != (pointer)(local_938 + 0x10)) goto LAB_0079f178;
      }
      iVar6 = (**(code **)(*plVar9 + 0x38))(plVar9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320,"\n\t\t// Check values in input ",0x1c);
      (**(code **)(*plVar9 + 0x10))((ostringstream *)local_870,plVar9);
      poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_320,(char *)local_870._0_8_,local_870._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
      if ((undefined1 *)local_870._0_8_ != local_860) {
        operator_delete((void *)local_870._0_8_,(ulong)(local_860._0_8_ + 1));
      }
      if ((int)local_898 == 1) {
        (**(code **)(*plVar9 + 0x30))((ostringstream *)local_870,plVar9,2,glslCheckBasicTypeObject);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_320,(char *)local_870._0_8_,local_870._8_8_);
      }
      else {
        (**(code **)(*plVar9 + 0x28))
                  ((ostringstream *)local_870,plVar9,local_898 & 0xffffffff,2,
                   glslCheckBasicTypeObject);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_320,(char *)local_870._0_8_,local_870._8_8_);
      }
      if ((undefined1 *)local_870._0_8_ != local_860) {
        operator_delete((void *)local_870._0_8_,(ulong)(local_860._0_8_ + 1));
      }
      iVar8 = iVar8 + iVar6;
      lVar22 = lVar22 + 1;
      pSVar15 = (this->m_tesInputs).
                super__Vector_base<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar20 = local_878 + 0x10;
    } while (lVar22 < (int)((ulong)((long)(this->m_tesInputs).
                                          super__Vector_base<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar15
                                   ) >> 4));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\t}\n",3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=(local_6a0,(string *)local_870);
  if ((undefined1 *)local_870._0_8_ != local_860) {
    operator_delete((void *)local_870._0_8_,(ulong)(local_860._0_8_ + 1));
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=(local_6a8,(string *)local_870);
  if ((undefined1 *)local_870._0_8_ != local_860) {
    operator_delete((void *)local_870._0_8_,(ulong)(local_860._0_8_ + 1));
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=(local_6b0,(string *)local_870);
  if ((undefined1 *)local_870._0_8_ != local_860) {
    operator_delete((void *)local_870._0_8_,(ulong)(local_860._0_8_ + 1));
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=(local_6b8,(string *)local_870);
  if ((undefined1 *)local_870._0_8_ != local_860) {
    operator_delete((void *)local_870._0_8_,(ulong)(local_860._0_8_ + 1));
  }
  glu::VarType::~VarType(&local_628);
  glu::VarType::~VarType(&local_670);
  std::__cxx11::ostringstream::~ostringstream(local_320);
  std::ios_base::~ios_base(local_2b0);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::~ostringstream(local_498);
  std::ios_base::~ios_base(local_428);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_610);
  std::ios_base::~ios_base(local_5a0);
  if (local_6f8 != &local_6e8) {
    operator_delete(local_6f8,local_6e8 + 1);
  }
  if (local_6d8 != &local_6c8) {
    operator_delete(local_6d8,local_6c8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_690._M_dataplus._M_p != &local_690.field_2) {
    operator_delete(local_690._M_dataplus._M_p,local_690.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

UserDefinedIOTest::UserDefinedIOTest (tcu::TestContext& testCtx, const std::string& name, const std::string& description, const CaseDefinition caseDef)
	: TestCase	(testCtx, name, description)
	, m_caseDef	(caseDef)
{
	const bool			isPerPatchIO				= m_caseDef.ioType == IO_TYPE_PER_PATCH				||
													  m_caseDef.ioType == IO_TYPE_PER_PATCH_ARRAY		||
													  m_caseDef.ioType == IO_TYPE_PER_PATCH_BLOCK		||
													  m_caseDef.ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY;

	const bool			isExplicitVertexArraySize	= m_caseDef.vertexIOArraySize == VERTEX_IO_ARRAY_SIZE_EXPLICIT_SHADER_BUILTIN ||
													  m_caseDef.vertexIOArraySize == VERTEX_IO_ARRAY_SIZE_EXPLICIT_SPEC_MIN;

	const std::string	vertexAttrArrayInputSize	= m_caseDef.vertexIOArraySize == VERTEX_IO_ARRAY_SIZE_IMPLICIT					? ""
													: m_caseDef.vertexIOArraySize == VERTEX_IO_ARRAY_SIZE_EXPLICIT_SHADER_BUILTIN	? "gl_MaxPatchVertices"
													: m_caseDef.vertexIOArraySize == VERTEX_IO_ARRAY_SIZE_EXPLICIT_SPEC_MIN			? de::toString(MAX_TESSELLATION_PATCH_SIZE)
													: DE_NULL;

	const char* const	maybePatch					= isPerPatchIO ? "patch " : "";
	const std::string	outMaybePatch				= std::string() + maybePatch + "out ";
	const std::string	inMaybePatch				= std::string() + maybePatch + "in ";
	const bool			useBlock					= m_caseDef.ioType == IO_TYPE_PER_VERTEX_BLOCK		||
													  m_caseDef.ioType == IO_TYPE_PER_PATCH_BLOCK		||
													  m_caseDef.ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY;
	const int			wrongNumElements			= -2;

	std::ostringstream tcsDeclarations;
	std::ostringstream tcsStatements;
	std::ostringstream tesDeclarations;
	std::ostringstream tesStatements;

	// Indices 0 and 1 are taken, see initPrograms()
	int tcsNextOutputLocation = 2;
	int tesNextInputLocation  = 2;

	m_structTypes.push_back(glu::StructType("S"));

	const glu::VarType	highpFloat		(glu::TYPE_FLOAT, glu::PRECISION_HIGHP);
	glu::StructType&	structType		= m_structTypes.back();
	const glu::VarType	structVarType	(&structType);
	bool				usedStruct		= false;

	structType.addMember("x", glu::VarType(glu::TYPE_INT,		 glu::PRECISION_HIGHP));
	structType.addMember("y", glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP));

	// It is illegal to have a structure containing an array as an output variable
	if (useBlock)
		structType.addMember("z", glu::VarType(highpFloat, 2));

	if (useBlock)
	{
		std::vector<IOBlock::Member> blockMembers;

		// use leaner block to make sure it is not larger than allowed (per-patch storage is very limited)
		const bool useLightweightBlock = (m_caseDef.ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY);

		if (!useLightweightBlock)
			blockMembers.push_back(IOBlock::Member("blockS",	structVarType));

		blockMembers.push_back(IOBlock::Member("blockFa",	glu::VarType(highpFloat, 3)));
		blockMembers.push_back(IOBlock::Member("blockSa",	glu::VarType(structVarType, 2)));
		blockMembers.push_back(IOBlock::Member("blockF",	highpFloat));

		m_tcsOutputs.push_back	(de::SharedPtr<TopLevelObject>(new IOBlock("TheBlock", "tcBlock", blockMembers)));
		m_tesInputs.push_back	(de::SharedPtr<TopLevelObject>(new IOBlock("TheBlock", "teBlock", blockMembers)));

		usedStruct = true;
	}
	else
	{
		const Variable var0("in_te_s", structVarType,	m_caseDef.ioType != IO_TYPE_PER_PATCH);
		const Variable var1("in_te_f", highpFloat,		m_caseDef.ioType != IO_TYPE_PER_PATCH);

		if (m_caseDef.ioType != IO_TYPE_PER_PATCH_ARRAY)
		{
			// Arrays of structures are disallowed, add struct cases only if not arrayed variable
			m_tcsOutputs.push_back	(de::SharedPtr<TopLevelObject>(new Variable(var0)));
			m_tesInputs.push_back	(de::SharedPtr<TopLevelObject>(new Variable(var0)));

			usedStruct = true;
		}

		m_tcsOutputs.push_back	(de::SharedPtr<TopLevelObject>(new Variable(var1)));
		m_tesInputs.push_back	(de::SharedPtr<TopLevelObject>(new Variable(var1)));
	}

	if (usedStruct)
		tcsDeclarations << de::toString(glu::declare(structType)) + ";\n";

	tcsStatements << "\t{\n"
				  << "\t\thighp float v = 1.3;\n";

	for (int tcsOutputNdx = 0; tcsOutputNdx < static_cast<int>(m_tcsOutputs.size()); ++tcsOutputNdx)
	{
		const TopLevelObject&	output		= *m_tcsOutputs[tcsOutputNdx];
		const int				numElements	= !isPerPatchIO										? -1	//!< \note -1 means indexing with gl_InstanceID
											: m_caseDef.ioType == IO_TYPE_PER_PATCH				? 1
											: m_caseDef.ioType == IO_TYPE_PER_PATCH_ARRAY		? NUM_PER_PATCH_ARRAY_ELEMS
											: m_caseDef.ioType == IO_TYPE_PER_PATCH_BLOCK		? 1
											: m_caseDef.ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY	? NUM_PER_PATCH_BLOCKS
											: wrongNumElements;
		const bool				isArray		= (numElements != 1);

		DE_ASSERT(numElements != wrongNumElements);

		// \note: TCS output arrays are always implicitly-sized
		tcsDeclarations << "layout(location = " << tcsNextOutputLocation << ") ";
		if (isArray)
			tcsDeclarations << outMaybePatch << output.declareArray(m_caseDef.ioType == IO_TYPE_PER_PATCH_ARRAY			? de::toString(NUM_PER_PATCH_ARRAY_ELEMS)
																  : m_caseDef.ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY	? de::toString(NUM_PER_PATCH_BLOCKS)
																  : "");
		else
			tcsDeclarations << outMaybePatch << output.declare();

		tcsNextOutputLocation += output.numBasicSubobjectsInElementType();

		if (!isPerPatchIO)
			tcsStatements << "\t\tv += float(gl_InvocationID)*" << de::floatToString(0.4f * (float)output.numBasicSubobjectsInElementType(), 1) << ";\n";

		tcsStatements << "\n\t\t// Assign values to output " << output.name() << "\n";
		if (isArray)
			tcsStatements << output.glslTraverseBasicTypeArray(numElements, 2, glslAssignBasicTypeObject);
		else
			tcsStatements << output.glslTraverseBasicType(2, glslAssignBasicTypeObject);

		if (!isPerPatchIO)
			tcsStatements << "\t\tv += float(" << de::toString(NUM_OUTPUT_VERTICES) << "-gl_InvocationID-1)*" << de::floatToString(0.4f * (float)output.numBasicSubobjectsInElementType(), 1) << ";\n";
	}
	tcsStatements << "\t}\n";

	tcsDeclarations << "\n"
					<< "layout(location = 0) in " + Variable("in_tc_attr", highpFloat, true).declareArray(vertexAttrArrayInputSize);

	if (usedStruct)
		tesDeclarations << de::toString(glu::declare(structType)) << ";\n";

	tesStatements << "\tbool allOk = true;\n"
				  << "\thighp uint firstFailedInputIndex = 0u;\n"
				  << "\t{\n"
				  << "\t\thighp float v = 1.3;\n";

	for (int tesInputNdx = 0; tesInputNdx < static_cast<int>(m_tesInputs.size()); ++tesInputNdx)
	{
		const TopLevelObject&	input		= *m_tesInputs[tesInputNdx];
		const int				numElements	= !isPerPatchIO										? NUM_OUTPUT_VERTICES
											: m_caseDef.ioType == IO_TYPE_PER_PATCH				? 1
											: m_caseDef.ioType == IO_TYPE_PER_PATCH_BLOCK		? 1
											: m_caseDef.ioType == IO_TYPE_PER_PATCH_ARRAY		? NUM_PER_PATCH_ARRAY_ELEMS
											: m_caseDef.ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY	? NUM_PER_PATCH_BLOCKS
											: wrongNumElements;
		const bool				isArray		= (numElements != 1);

		DE_ASSERT(numElements != wrongNumElements);

		tesDeclarations << "layout(location = " << tesNextInputLocation << ") ";
		if (isArray)
			tesDeclarations << inMaybePatch << input.declareArray(m_caseDef.ioType == IO_TYPE_PER_PATCH_ARRAY		? de::toString(NUM_PER_PATCH_ARRAY_ELEMS)
																: m_caseDef.ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY	? de::toString(NUM_PER_PATCH_BLOCKS)
																: isExplicitVertexArraySize							? de::toString(vertexAttrArrayInputSize)
																: "");
		else
			tesDeclarations << inMaybePatch + input.declare();

		tesNextInputLocation += input.numBasicSubobjectsInElementType();

		tesStatements << "\n\t\t// Check values in input " << input.name() << "\n";
		if (isArray)
			tesStatements << input.glslTraverseBasicTypeArray(numElements, 2, glslCheckBasicTypeObject);
		else
			tesStatements << input.glslTraverseBasicType(2, glslCheckBasicTypeObject);
	}
	tesStatements << "\t}\n";

	m_tcsDeclarations = tcsDeclarations.str();
	m_tcsStatements   = tcsStatements.str();
	m_tesDeclarations = tesDeclarations.str();
	m_tesStatements   = tesStatements.str();
}